

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImU32 ImHashData(void *data_p,size_t data_size,ImU32 seed)

{
  ImU32 *crc32_lut;
  uchar *data;
  ImU32 crc;
  ImU32 seed_local;
  size_t data_size_local;
  void *data_p_local;
  
  crc = seed ^ 0xffffffff;
  data = (uchar *)data_p;
  data_size_local = data_size;
  while (data_size_local != 0) {
    crc = crc >> 8 ^ GCrc32LookupTable[crc & 0xff ^ (uint)*data];
    data = data + 1;
    data_size_local = data_size_local - 1;
  }
  return crc ^ 0xffffffff;
}

Assistant:

ImU32 ImHashData(const void* data_p, size_t data_size, ImU32 seed)
{
    ImU32 crc = ~seed;
    const unsigned char* data = (const unsigned char*)data_p;
    const ImU32* crc32_lut = GCrc32LookupTable;
    while (data_size-- != 0)
        crc = (crc >> 8) ^ crc32_lut[(crc & 0xFF) ^ *data++];
    return ~crc;
}